

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field.cpp
# Opt level: O0

bool __thiscall bidfx_public_api::price::PriceField::operator==(PriceField *this,PriceField *pf)

{
  Type TVar1;
  code *pcVar2;
  PriceField *pf_local;
  PriceField *this_local;
  
  switch(this->type_) {
  case INTEGER:
    TVar1 = pf->type_;
    if (TVar1 == INTEGER) {
      this_local._7_1_ = (this->field_1).int_value_ == (pf->field_1).int_value_;
    }
    else if (TVar1 == LONG) {
      this_local._7_1_ = (long)(this->field_1).int_value_ == (pf->field_1).long_value_;
    }
    else if (TVar1 == DOUBLE) {
      this_local._7_1_ = (double)(this->field_1).int_value_ == (pf->field_1).double_value_;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case LONG:
    TVar1 = pf->type_;
    if (TVar1 == INTEGER) {
      this_local._7_1_ = (this->field_1).long_value_ == (long)(pf->field_1).int_value_;
    }
    else if (TVar1 == LONG) {
      this_local._7_1_ = (this->field_1).long_value_ == (pf->field_1).long_value_;
    }
    else if (TVar1 == DOUBLE) {
      this_local._7_1_ = (double)(this->field_1).long_value_ == (pf->field_1).double_value_;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case DOUBLE:
    TVar1 = pf->type_;
    if (TVar1 == INTEGER) {
      this_local._7_1_ = (this->field_1).double_value_ == (double)(pf->field_1).int_value_;
    }
    else if (TVar1 == LONG) {
      this_local._7_1_ = (this->field_1).double_value_ == (double)(pf->field_1).long_value_;
    }
    else if (TVar1 == DOUBLE) {
      this_local._7_1_ = (this->field_1).double_value_ == (pf->field_1).double_value_;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case STRING:
    if (pf->type_ == STRING) {
      this_local._7_1_ = std::operator==((this->field_1).string_value_,(pf->field_1).string_value_);
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case NOTHING:
    this_local._7_1_ = pf->type_ == NOTHING;
    break;
  default:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  return this_local._7_1_;
}

Assistant:

const bool PriceField::operator==(const PriceField &pf) const
{
    switch(type_)
    {
        case INTEGER:
            switch(pf.type_)
            {
                case INTEGER:
                    return int_value_ == pf.int_value_;
                case LONG:
                    return int_value_ == pf.long_value_;
                case DOUBLE:
                    return int_value_ == pf.double_value_;
                default:
                    return false;
            }
        case LONG:
            switch(pf.type_)
            {
                case INTEGER:
                    return long_value_ == pf.int_value_;
                case LONG:
                    return long_value_ == pf.long_value_;
                case DOUBLE:
                    return long_value_ == pf.double_value_;
                default:
                    return false;
            }
        case DOUBLE:
            switch(pf.type_)
            {
                case INTEGER:
                    return double_value_ == pf.int_value_;
                case LONG:
                    return double_value_ == pf.long_value_;
                case DOUBLE:
                    return double_value_ == pf.double_value_;
                default:
                    return false;
            }
        case STRING:
            switch (pf.type_)
            {
                case STRING:
                    return *string_value_ == *pf.string_value_;
                default:
                    return false;
            }
        case NOTHING:
            return pf.type_ == NOTHING;
    }
}